

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

void scalarminus_dsp(t_scalarminus *x,t_signal **sp)

{
  code *f;
  
  if (((*sp)->s_n & 7U) == 0) {
    f = scalarminus_perf8;
  }
  else {
    f = scalarminus_perform;
  }
  dsp_add(f,4,(*sp)->s_vec,&x->x_g,sp[1]->s_vec);
  return;
}

Assistant:

static void scalarminus_dsp(t_scalarminus *x, t_signal **sp)
{
    if (sp[0]->s_n&7)
        dsp_add(scalarminus_perform, 4, sp[0]->s_vec, &x->x_g,
            sp[1]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(scalarminus_perf8, 4, sp[0]->s_vec, &x->x_g,
            sp[1]->s_vec, (t_int)sp[0]->s_n);
}